

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void SendSetup(DWORD *playersdetected,BYTE *gotsetup,int len)

{
  SWORD SVar1;
  BYTE BVar2;
  int len_00;
  long lVar3;
  
  if (consoleplayer == Net_Arbitrator) {
    if (1 < doomcom.numnodes) {
      lVar3 = 1;
      BVar2 = doomcom.data[0];
      SVar1 = doomcom.numnodes;
      do {
        if ((gotsetup[lVar3] == '\0') || (BVar2 == '#')) {
          HSendPacket((int)lVar3,len);
          BVar2 = doomcom.data[0];
          SVar1 = doomcom.numnodes;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < SVar1);
    }
    return;
  }
  len_00 = 10;
  if ((playersdetected[1] >> (consoleplayer & 0x1fU) & 1) == 0) {
    len_00 = len;
  }
  HSendPacket(1,len_00);
  return;
}

Assistant:

static void SendSetup (DWORD playersdetected[MAXNETNODES], BYTE gotsetup[MAXNETNODES], int len)
{
	if (consoleplayer != Net_Arbitrator)
	{
		if (playersdetected[1] & (1 << consoleplayer))
		{
			HSendPacket (1, 10);
		}
		else
		{
			HSendPacket (1, len);
		}
	}
	else
	{
		for (int i = 1; i < doomcom.numnodes; ++i)
		{
			if (!gotsetup[i] || netbuffer[0] == NCMD_SETUP+3)
			{
				HSendPacket (i, len);
			}
		}
	}
}